

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkTrace_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int iFrame,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues
                     ,word ValueA,Vec_Int_t *vRes)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  word wVar5;
  int Index_1;
  int Value;
  int Index;
  int iPiObj;
  int PiId;
  int iNum;
  int iObj;
  word ValueA_local;
  Vec_Wrd_t *vValues_local;
  Vec_Int_t *vMemObjs_local;
  int iFrame_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_ObjId(p,pObj);
  iVar2 = Wlc_ObjCopy(p,iVar1);
  iVar3 = Vec_IntEntry(vMemObjs,iVar2);
  if (iVar1 != iVar3) {
    __assert_fail("iObj == Vec_IntEntry(vMemObjs, iNum)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x311,
                  "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                 );
  }
  if (iFrame < 0) {
    __assert_fail("iFrame >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x312,
                  "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                 );
  }
  iVar3 = Wlc_ObjIsPi(pObj);
  if (iVar3 == 0) {
    iVar3 = Wlc_ObjIsCi(pObj);
    if ((iVar3 == 0) || (iFrame != 0)) {
      iVar3 = Wlc_ObjIsCi(pObj);
      if (iVar3 == 0) {
        iVar3 = Wlc_ObjType(pObj);
        if (iVar3 == 7) {
          pWVar4 = Wlc_ObjFanin0(p,pObj);
          Wlc_NtkTrace_rec(p,pWVar4,iFrame,vMemObjs,vValues,ValueA,vRes);
        }
        else {
          iVar3 = Wlc_ObjType(pObj);
          if (iVar3 == 8) {
            iVar1 = Vec_IntSize(vMemObjs);
            Vec_WrdEntry(vValues,(iFrame * iVar1 + iVar2) * 3);
            __assert_fail("Value == 0 && Value == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x323,
                          "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                         );
          }
          iVar3 = Wlc_ObjType(pObj);
          if (iVar3 != 0x37) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x32e,
                          "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                         );
          }
          iVar3 = Vec_IntSize(vMemObjs);
          wVar5 = Vec_WrdEntry(vValues,(iFrame * iVar3 + iVar2) * 3 + 1);
          if (wVar5 != ValueA) {
            pWVar4 = Wlc_ObjFanin0(p,pObj);
            Wlc_NtkTrace_rec(p,pWVar4,iFrame,vMemObjs,vValues,ValueA,vRes);
          }
          Vec_IntPush(vRes,iVar1 << 0xb | iFrame << 1);
        }
      }
      else {
        pWVar4 = Wlc_ObjFo2Fi(p,pObj);
        Wlc_NtkTrace_rec(p,pWVar4,iFrame + -1,vMemObjs,vValues,ValueA,vRes);
      }
    }
    else {
      p_00 = p->vInits;
      iVar1 = Wlc_ObjCiId(pObj);
      iVar2 = Wlc_NtkPiNum(p);
      iVar1 = Vec_IntEntry(p_00,iVar1 - iVar2);
      pWVar4 = Wlc_NtkPi(p,iVar1);
      iVar1 = Wlc_ObjId(p,pWVar4);
      Vec_IntPush(vRes,iVar1 << 0xb);
    }
  }
  else {
    Vec_IntPush(vRes,iVar1 << 0xb | iFrame << 1);
  }
  return;
}

Assistant:

void Wlc_NtkTrace_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int iFrame, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, word ValueA, Vec_Int_t * vRes )
{
    int iObj = Wlc_ObjId(p, pObj);
    int iNum = Wlc_ObjCopy( p, iObj );
    assert( iObj == Vec_IntEntry(vMemObjs, iNum) );
    assert( iFrame >= 0 );
    if ( Wlc_ObjIsPi(pObj) ) 
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    else if ( Wlc_ObjIsCi(pObj) && iFrame == 0 ) 
    {
        int PiId = Vec_IntEntry(p->vInits, Wlc_ObjCiId(pObj)-Wlc_NtkPiNum(p) );
        int iPiObj = Wlc_ObjId( p, Wlc_NtkPi(p, PiId) );
        Vec_IntPush( vRes, (iPiObj << 11) | (iFrame << 1) );
    }
    else if ( Wlc_ObjIsCi(pObj) )
        Wlc_NtkTrace_rec( p, Wlc_ObjFo2Fi(p, pObj), iFrame - 1, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_BUF )
        Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        int Value = (int)Vec_WrdEntry( vValues, Index );
        assert( Value == 0 && Value == 1 );
        Wlc_NtkTrace_rec( p, Value ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) | Value );
    }
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        if ( Vec_WrdEntry(vValues, Index + 1) != ValueA ) // address 
            Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    }
    else assert( 0 );
}